

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint128_c_t farmhash128_cc_city_with_seed(char *s,size_t len,uint128_c_t seed)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint128_c_t uVar21;
  
  uVar19 = seed.b;
  uVar11 = seed.a;
  if (len < 0x80) {
    if (len < 0x11) {
      lVar13 = -0x651e95c4d06fbfb1;
      uVar11 = (uVar11 * -0x4b6d499041670d8d >> 0x2f ^ uVar11 * -0x4b6d499041670d8d) *
               -0x4b6d499041670d8d;
      if (len < 8) {
        if (len < 4) {
          if (len != 0) {
            uVar9 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                    (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
            lVar13 = (uVar9 >> 0x2f ^ uVar9) * -0x651e95c4d06fbfb1;
          }
        }
        else {
          lVar13 = len * 2 + -0x651e95c4d06fbfb1;
          uVar9 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar13;
          uVar9 = (uVar9 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar9) * lVar13;
          lVar13 = (uVar9 >> 0x2f ^ uVar9) * lVar13;
        }
        uVar18 = lVar13 + uVar19 * -0x4b6d499041670d8d;
        uVar9 = uVar18;
      }
      else {
        lVar13 = len * 2 + -0x651e95c4d06fbfb1;
        uVar9 = *(ulong *)(s + (len - 8));
        uVar18 = *(ulong *)s;
        uVar14 = uVar18 + 0x9ae16a3b2f90404f;
        uVar15 = ((uVar14 >> 0x19 | uVar14 << 0x27) + uVar9) * lVar13;
        uVar9 = ((uVar9 >> 0x25 | uVar9 << 0x1b) * lVar13 + uVar14 ^ uVar15) * lVar13;
        uVar9 = (uVar9 >> 0x2f ^ uVar15 ^ uVar9) * lVar13;
        uVar9 = (uVar9 >> 0x2f ^ uVar9) * lVar13 + uVar19 * -0x4b6d499041670d8d;
      }
      uVar14 = uVar18 + uVar11 >> 0x2f ^ uVar18 + uVar11;
    }
    else {
      uVar18 = len + 0x10;
      uVar9 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar11) * -0x622015f714c7d297;
      uVar9 = (uVar9 >> 0x2f ^ uVar11 ^ uVar9) * -0x622015f714c7d297;
      uVar9 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297;
      uVar14 = (uVar19 + len ^ *(long *)(s + (len - 0x10)) + uVar9) * -0x622015f714c7d297;
      uVar14 = (uVar14 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar9 ^ uVar14) * -0x622015f714c7d297
      ;
      uVar14 = (uVar14 >> 0x2f ^ uVar14) * -0x622015f714c7d297;
      uVar11 = uVar11 + uVar14;
      do {
        lVar13 = *(long *)s;
        uVar18 = uVar18 - 0x10;
        plVar8 = (long *)((long)s + 8);
        s = (char *)((long)s + 0x10);
        uVar11 = (((ulong)(lVar13 * -0x4b6d499041670d8d) >> 0x2f ^ lVar13 * -0x4b6d499041670d8d) *
                  -0x4b6d499041670d8d ^ uVar11) * -0x4b6d499041670d8d;
        uVar19 = uVar19 ^ uVar11;
        uVar9 = (((ulong)(*plVar8 * -0x4b6d499041670d8d) >> 0x2f ^ *plVar8 * -0x4b6d499041670d8d) *
                 -0x4b6d499041670d8d ^ uVar9) * -0x4b6d499041670d8d;
        uVar14 = uVar14 ^ uVar9;
      } while (0x20 < uVar18);
    }
    uVar11 = (uVar11 ^ uVar9) * -0x622015f714c7d297;
    uVar18 = (uVar14 ^ uVar19) * -0x622015f714c7d297;
    uVar11 = (uVar11 >> 0x2f ^ uVar9 ^ uVar11) * -0x622015f714c7d297;
    uVar19 = (uVar18 >> 0x2f ^ uVar19 ^ uVar18) * -0x622015f714c7d297;
    uVar9 = (uVar11 >> 0x2f ^ uVar11) * -0x622015f714c7d297;
    uVar11 = (uVar19 >> 0x2f ^ uVar19) * -0x622015f714c7d297 ^ uVar9;
    uVar19 = uVar11;
  }
  else {
    uVar15 = len * -0x4b6d499041670d8d;
    uVar18 = ((uVar19 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar19 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)s;
    uVar14 = (*(long *)(s + 0x58) + uVar11 >> 0x35 | (*(long *)(s + 0x58) + uVar11) * 0x800) *
             -0x4b6d499041670d8d;
    lVar13 = (uVar18 >> 0x2a | uVar18 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar9 = (uVar15 + uVar19 >> 0x23 | (uVar15 + uVar19) * 0x20000000) * -0x4b6d499041670d8d +
            uVar11;
    plVar8 = (long *)(s + 0x78);
    sVar17 = len;
    do {
      sVar17 = sVar17 - 0x80;
      lVar12 = lVar13 * -0x4b6d499041670d8d + plVar8[-0xf];
      uVar4 = uVar19 + lVar13 + plVar8[-9];
      uVar19 = uVar11 + uVar19 + uVar18 + plVar8[-0xe];
      uVar6 = plVar8[-0xe] + lVar12 + plVar8[-0xd];
      lVar5 = uVar18 + plVar8[-10] + (uVar4 >> 0x2a | uVar4 * 0x400000) * -0x4b6d499041670d8d;
      uVar11 = (uVar19 >> 0x25 | uVar19 * 0x8000000) * -0x4b6d499041670d8d ^ uVar14;
      lVar13 = (uVar15 + uVar9 >> 0x21 | (uVar15 + uVar9) * 0x80000000) * -0x4b6d499041670d8d;
      lVar16 = uVar14 + lVar13 + plVar8[-0xb];
      lVar7 = uVar6 + plVar8[-0xc];
      uVar19 = uVar9 + lVar12 + plVar8[-0xc] + uVar11;
      lVar10 = (uVar6 >> 0x2c | uVar6 * 0x100000) + lVar12 + (uVar19 >> 0x15 | uVar19 << 0x2b);
      uVar9 = lVar13 + lVar7 + plVar8[-6] + lVar5;
      uVar18 = plVar8[-10] + plVar8[-9] + lVar16;
      uVar19 = plVar8[-0xd] + lVar16 + lVar5 + plVar8[-8];
      lVar20 = uVar18 + plVar8[-8];
      uVar11 = uVar11 + lVar20;
      uVar19 = (uVar18 >> 0x2c | uVar18 * 0x100000) + lVar16 + (uVar19 >> 0x15 | uVar19 << 0x2b);
      plVar1 = plVar8 + -5;
      uVar11 = (uVar11 >> 0x21 | uVar11 * 0x80000000) * -0x4b6d499041670d8d;
      uVar15 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar19;
      lVar12 = uVar19 + uVar11 + plVar8[-3];
      uVar19 = lVar5 + plVar8[-1] + lVar10;
      lVar13 = lVar10 * -0x4b6d499041670d8d + plVar8[-7];
      uVar4 = plVar8[-2] + plVar8[-1] + lVar12;
      uVar9 = plVar8[-6] + *plVar1 + lVar13;
      uVar19 = lVar7 + plVar8[-2] + (uVar19 >> 0x2a | uVar19 * 0x400000) * -0x4b6d499041670d8d;
      uVar18 = uVar9 + plVar8[-4];
      uVar14 = lVar20 + uVar15 + plVar8[-4] + lVar13;
      lVar5 = *plVar8;
      plVar8 = plVar8 + 0x10;
      lVar13 = (uVar9 >> 0x2c | uVar9 * 0x100000) + lVar13 + (uVar14 >> 0x15 | uVar14 << 0x2b);
      uVar9 = uVar4 + lVar5;
      uVar14 = *plVar1 + uVar19 + lVar5 + lVar12;
      uVar14 = (uVar4 >> 0x2c | uVar4 * 0x100000) + lVar12 + (uVar14 >> 0x15 | uVar14 << 0x2b);
    } while (0x7f < sVar17);
    uVar4 = uVar18 * -0x3c5a37a36834ced9;
    lVar5 = (uVar9 >> 0x1b | uVar9 << 0x25) + uVar15 * -0x3c5a37a36834ced9;
    uVar11 = (uVar18 + uVar15 >> 0x31 | (uVar18 + uVar15) * 0x8000) * -0x3c5a37a36834ced9 + uVar11;
    lVar12 = (uVar14 >> 0x25 | uVar14 * 0x8000000) + uVar19 * -0x3c5a37a36834ced9;
    uVar9 = uVar9 * 9;
    if (sVar17 != 0) {
      plVar8 = (long *)(s + (len - 8));
      uVar19 = 0;
      do {
        plVar1 = plVar8 + -1;
        plVar2 = plVar8 + -3;
        lVar7 = *plVar8;
        lVar5 = lVar5 + uVar14;
        uVar14 = uVar14 + uVar4;
        uVar19 = uVar19 + 0x20;
        uVar9 = uVar9 + *plVar1;
        plVar3 = plVar8 + -2;
        lVar5 = lVar5 + *plVar2;
        lVar12 = (lVar12 + uVar11 >> 0x2a | (lVar12 + uVar11) * 0x400000) * -0x3c5a37a36834ced9 +
                 lVar13;
        plVar8 = plVar8 + -4;
        lVar10 = *plVar2 + uVar4 + lVar5;
        uVar11 = uVar11 * -0x3c5a37a36834ced9 + uVar9;
        uVar15 = lVar13 + lVar7 + lVar10;
        uVar18 = *plVar1 + *plVar3 + lVar10;
        uVar4 = (uVar18 + lVar7) * -0x3c5a37a36834ced9;
        lVar13 = (uVar18 >> 0x2c | uVar18 * 0x100000) + lVar10 + (uVar15 >> 0x15 | uVar15 << 0x2b);
      } while (uVar19 < sVar17);
    }
    uVar11 = (uVar11 ^ uVar4) * -0x622015f714c7d297;
    uVar19 = (lVar5 + lVar12 ^ uVar9) * -0x622015f714c7d297;
    uVar11 = (uVar11 >> 0x2f ^ uVar4 ^ uVar11) * -0x622015f714c7d297;
    uVar19 = (uVar19 >> 0x2f ^ uVar9 ^ uVar19) * -0x622015f714c7d297;
    lVar5 = (uVar11 >> 0x2f ^ uVar11) * -0x622015f714c7d297;
    uVar19 = uVar19 >> 0x2f ^ uVar19;
    uVar11 = (lVar5 + lVar13 ^ uVar14) * -0x622015f714c7d297;
    uVar11 = (uVar11 >> 0x2f ^ uVar14 ^ uVar11) * -0x622015f714c7d297;
    uVar11 = ((uVar11 >> 0x2f ^ uVar11) + uVar19) * -0x622015f714c7d297;
    uVar9 = uVar19 * -0x622015f714c7d297 + lVar13;
    uVar19 = lVar5 + uVar14 ^ uVar9;
  }
  uVar19 = (uVar19 * -0x622015f714c7d297 >> 0x2f ^ uVar9 ^ uVar19 * -0x622015f714c7d297) *
           -0x622015f714c7d297;
  uVar21.b = (uVar19 >> 0x2f ^ uVar19) * -0x622015f714c7d297;
  uVar21.a = uVar11;
  return uVar21;
}

Assistant:

uint128_c_t farmhash128_cc_city_with_seed(const char *s, size_t len, uint128_c_t seed) {
  if (len < 128) {
    return farmhash_cc_city_murmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  uint128_c_t v, w;
  uint64_t x = uint128_c_t_low64(seed);
  uint64_t y = uint128_c_t_high64(seed);
  uint64_t z = len * k1;
  size_t tail_done;

  v.a = ror64(y ^ k1, 49) * k1 + fetch64(s);
  v.b = ror64(v.a, 42) * k1 + fetch64(s + 8);
  w.a = ror64(y + z, 35) * k1 + x;
  w.b = ror64(x + fetch64(s + 88), 53) * k1;

  // This is the same inner loop as cityhash64(), manually unrolled.
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    len -= 128;
  } while (likely(len >= 128));
  x += ror64(v.a + z, 49) * k0;
  y = y * k0 + ror64(w.b, 37);
  z = z * k0 + ror64(w.a, 27);
  w.a *= 9;
  v.a *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = ror64(x + y, 42) * k0 + v.b;
    w.a += fetch64(s + len - tail_done + 16);
    x = x * k0 + w.a;
    z += w.b + fetch64(s + len - tail_done);
    w.b += v.a;
    v = weak_farmhash_cc_len_32_with_seeds(s + len - tail_done, v.a + z, v.b);
    v.a *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = farmhash_len_16(x, v.a);
  y = farmhash_len_16(y + z, w.a);
  return make_uint128_c_t(farmhash_len_16(x + v.b, w.b) + y,
                   farmhash_len_16(x + w.b, y + v.b));
}